

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_multiple_data_objects.c
# Opt level: O0

wchar_t file_switch(archive_conflict *a,void *client_data1,void *client_data2)

{
  wchar_t wVar1;
  void *client_data2_local;
  void *client_data1_local;
  archive_conflict *a_local;
  
  file_close2(a,client_data1);
  wVar1 = file_open(a,client_data2);
  return wVar1;
}

Assistant:

static int
file_switch(struct archive *a, void *data1, void *data2)
{
  struct mydata *mydata1 = (struct mydata *)data1;
  struct mydata *mydata2 = (struct mydata *)data2;
  int r = (ARCHIVE_OK);

  (void)a;
  if (mydata1 && mydata1->fd >= 0)
  {
    close(mydata1->fd);
    free(mydata1->buffer);
    mydata1->buffer = NULL;
    mydata1->fd = -1;
  }
  if (mydata2)
  {
    r = file_open(a, mydata2);
  }
  return (r);
}